

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlFdClose(void *context)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = close(*context);
  (*xmlFree)(context);
  if (-1 < iVar1) {
    return 0;
  }
  piVar2 = __errno_location();
  iVar1 = xmlIOErr(*piVar2);
  return iVar1;
}

Assistant:

static int
xmlFdClose (void * context) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret;

    ret = close(fd);

    xmlFree(fdctxt);

    if (ret < 0)
        return(xmlIOErr(errno));

    return(XML_ERR_OK);
}